

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjInitFromString(jx9_vm *pVm,jx9_value *pObj,SyString *pVal)

{
  SyString *pVal_local;
  jx9_value *pObj_local;
  jx9_vm *pVm_local;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  SyBlobInit(&pObj->sBlob,&pVm->sAllocator);
  if (pVal != (SyString *)0x0) {
    SyBlobAppend(&pObj->sBlob,pVal->zString,pVal->nByte);
  }
  pObj->iFlags = 1;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInitFromString(jx9_vm *pVm, jx9_value *pObj, const SyString *pVal)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	if( pVal ){
		/* Append contents */
		SyBlobAppend(&pObj->sBlob, (const void *)pVal->zString, pVal->nByte);
	}
	/* Set the desired type */
	pObj->iFlags = MEMOBJ_STRING;
	return SXRET_OK;
}